

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_err_t * mpc_err_new(mpc_input_t *i,char *expected)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 uVar4;
  char cVar5;
  mpc_err_t *pmVar6;
  size_t sVar7;
  char *pcVar8;
  char **ppcVar9;
  
  if (i->suppress == 0) {
    pmVar6 = (mpc_err_t *)mpc_malloc(i,0x48);
    sVar7 = strlen(i->filename);
    pcVar8 = (char *)mpc_malloc(i,sVar7 + 1);
    pmVar6->filename = pcVar8;
    strcpy(pcVar8,i->filename);
    lVar1 = (i->state).row;
    lVar2 = (i->state).col;
    iVar3 = (i->state).term;
    uVar4 = *(undefined4 *)&(i->state).field_0x1c;
    (pmVar6->state).pos = (i->state).pos;
    (pmVar6->state).row = lVar1;
    (pmVar6->state).col = lVar2;
    (pmVar6->state).term = iVar3;
    *(undefined4 *)&(pmVar6->state).field_0x1c = uVar4;
    pmVar6->expected_num = 1;
    ppcVar9 = (char **)mpc_malloc(i,8);
    pmVar6->expected = ppcVar9;
    sVar7 = strlen(expected);
    pcVar8 = (char *)mpc_malloc(i,sVar7 + 1);
    *pmVar6->expected = pcVar8;
    strcpy(*pmVar6->expected,expected);
    pmVar6->failure = (char *)0x0;
    cVar5 = mpc_input_peekc(i);
    pmVar6->received = cVar5;
  }
  else {
    pmVar6 = (mpc_err_t *)0x0;
  }
  return pmVar6;
}

Assistant:

static mpc_err_t *mpc_err_new(mpc_input_t *i, const char *expected) {
  mpc_err_t *x;
  if (i->suppress) { return NULL; }
  x = mpc_malloc(i, sizeof(mpc_err_t));
  x->filename = mpc_malloc(i, strlen(i->filename) + 1);
  strcpy(x->filename, i->filename);
  x->state = i->state;
  x->expected_num = 1;
  x->expected = mpc_malloc(i, sizeof(char*));
  x->expected[0] = mpc_malloc(i, strlen(expected) + 1);
  strcpy(x->expected[0], expected);
  x->failure = NULL;
  x->received = mpc_input_peekc(i);
  return x;
}